

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool clone_ssl_primary_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  _Bool _Var5;
  CURLcode CVar6;
  char *pcVar7;
  
  dest->version = source->version;
  dest->version_max = source->version_max;
  bVar2 = source->field_0x79 & 1;
  bVar1 = dest->field_0x79;
  dest->field_0x79 = bVar1 & 0xfe | bVar2;
  bVar3 = source->field_0x79 & 2;
  dest->field_0x79 = bVar1 & 0xfc | bVar2 | bVar3;
  bVar4 = source->field_0x79 & 4;
  dest->field_0x79 = bVar1 & 0xf8 | bVar2 | bVar3 | bVar4;
  dest->field_0x79 = bVar1 & 0xf0 | bVar2 | bVar3 | bVar4 | source->field_0x79 & 8;
  dest->ssl_options = source->ssl_options;
  CVar6 = blobdup(&dest->cert_blob,source->cert_blob);
  if (((CVar6 == CURLE_OK) &&
      (CVar6 = blobdup(&dest->ca_info_blob,source->ca_info_blob), CVar6 == CURLE_OK)) &&
     (CVar6 = blobdup(&dest->issuercert_blob,source->issuercert_blob), CVar6 == CURLE_OK)) {
    if (source->CApath == (char *)0x0) {
      dest->CApath = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->CApath);
      dest->CApath = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->CAfile == (char *)0x0) {
      dest->CAfile = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->CAfile);
      dest->CAfile = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->issuercert == (char *)0x0) {
      dest->issuercert = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->issuercert);
      dest->issuercert = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->clientcert == (char *)0x0) {
      dest->clientcert = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->clientcert);
      dest->clientcert = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->cipher_list13 == (char *)0x0) {
      dest->cipher_list13 = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->cipher_list13);
      dest->cipher_list13 = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->pinned_key == (char *)0x0) {
      dest->pinned_key = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->pinned_key);
      dest->pinned_key = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->curves == (char *)0x0) {
      dest->curves = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->curves);
      dest->curves = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->CRLfile == (char *)0x0) {
      dest->CRLfile = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->CRLfile);
      dest->CRLfile = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->username == (char *)0x0) {
      dest->username = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->username);
      dest->username = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    if (source->password == (char *)0x0) {
      dest->password = (char *)0x0;
    }
    else {
      pcVar7 = (*Curl_cstrdup)(source->password);
      dest->password = pcVar7;
      if (pcVar7 == (char *)0x0) goto LAB_00169672;
    }
    _Var5 = true;
  }
  else {
LAB_00169672:
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

static bool clone_ssl_primary_config(struct ssl_primary_config *source,
                                     struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->cache_session = source->cache_session;
  dest->ssl_options = source->ssl_options;

  CLONE_BLOB(cert_blob);
  CLONE_BLOB(ca_info_blob);
  CLONE_BLOB(issuercert_blob);
  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(issuercert);
  CLONE_STRING(clientcert);
  CLONE_STRING(cipher_list);
  CLONE_STRING(cipher_list13);
  CLONE_STRING(pinned_key);
  CLONE_STRING(curves);
  CLONE_STRING(CRLfile);
#ifdef USE_TLS_SRP
  CLONE_STRING(username);
  CLONE_STRING(password);
#endif

  return TRUE;
}